

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O3

String * Rml::StringUtilities::Replace
                   (String *__return_storage_ptr__,String *subject,String *search,String *replace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  
  for (uVar4 = ::std::__cxx11::string::find((char *)subject,(ulong)(search->_M_dataplus)._M_p,0);
      uVar4 != 0xffffffffffffffff;
      uVar4 = ::std::__cxx11::string::find
                        ((char *)subject,(ulong)(search->_M_dataplus)._M_p,
                         uVar4 + replace->_M_string_length)) {
    ::std::__cxx11::string::replace
              ((ulong)subject,uVar4,(char *)search->_M_string_length,
               (ulong)(replace->_M_dataplus)._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (subject->_M_dataplus)._M_p;
  paVar1 = &subject->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&subject->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = subject->_M_string_length;
  (subject->_M_dataplus)._M_p = (pointer)paVar1;
  subject->_M_string_length = 0;
  (subject->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

String StringUtilities::Replace(String subject, const String& search, const String& replace)
{
	size_t pos = 0;
	while ((pos = subject.find(search, pos)) != String::npos)
	{
		subject.replace(pos, search.length(), replace);
		pos += replace.length();
	}
	return subject;
}